

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O3

void __thiscall Json::Value::Value(Value *this,char *value)

{
  size_t sVar1;
  char *pcVar2;
  pointer *__ptr;
  OStringStream oss;
  String SStack_1a8;
  ostream local_188;
  
  *(ushort *)&this->bits_ = SUB42(this->bits_,0) & 0xfe00 | 0x104;
  (this->comments_).ptr_._M_t.
  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
  .
  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
  ._M_head_impl =
       (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
        *)0x0;
  this->start_ = 0;
  this->limit_ = 0;
  if (value != (char *)0x0) {
    sVar1 = strlen(value);
    pcVar2 = duplicateAndPrefixStringValue(value,(uint)sVar1);
    (this->value_).string_ = pcVar2;
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_188);
  std::__ostream_insert<char,std::char_traits<char>>
            (&local_188,"Null Value Passed to Value Constructor",0x26);
  std::__cxx11::stringbuf::str();
  throwLogicError(&SStack_1a8);
}

Assistant:

Value::Value(const char* value) {
  initBasic(stringValue, true);
  JSON_ASSERT_MESSAGE(value != nullptr,
                      "Null Value Passed to Value Constructor");
  value_.string_ = duplicateAndPrefixStringValue(
      value, static_cast<unsigned>(strlen(value)));
}